

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

ConstPixelBufferAccess *
tcu::getSubregion(ConstPixelBufferAccess *__return_storage_ptr__,ConstPixelBufferAccess *access,
                 int x,int y,int z,int width,int height,int depth)

{
  IVec3 local_14;
  
  local_14.m_data[1] = height;
  local_14.m_data[2] = depth;
  local_14.m_data[0] = width;
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,&access->m_format,&local_14,&access->m_pitch,
             (void *)((long)access->m_data +
                     (long)(z * (access->m_pitch).m_data[2]) +
                     (long)(y * (access->m_pitch).m_data[1]) +
                     (long)(x * (access->m_pitch).m_data[0])));
  return __return_storage_ptr__;
}

Assistant:

ConstPixelBufferAccess getSubregion (const ConstPixelBufferAccess& access, int x, int y, int z, int width, int height, int depth)
{
	DE_ASSERT(de::inBounds(x, 0, access.getWidth()));
	DE_ASSERT(de::inRange(x+width, x+1, access.getWidth()));

	DE_ASSERT(de::inBounds(y, 0, access.getHeight()));
	DE_ASSERT(de::inRange(y+height, y+1, access.getHeight()));

	DE_ASSERT(de::inBounds(z, 0, access.getDepth()));
	DE_ASSERT(de::inRange(z+depth, z+1, access.getDepth()));

	return ConstPixelBufferAccess(access.getFormat(), tcu::IVec3(width, height, depth), access.getPitch(),
								  (const deUint8*)access.getDataPtr() + access.getPixelPitch()*x + access.getRowPitch()*y + access.getSlicePitch()*z);
}